

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

void __thiscall
QGraphicsItemPrivate::setSubFocus
          (QGraphicsItemPrivate *this,QGraphicsItem *rootItem,QGraphicsItem *stopItem)

{
  QGraphicsItemPrivate *pQVar1;
  long lVar2;
  bool bVar3;
  QGraphicsItem *pQVar4;
  QGraphicsItem *pQVar5;
  
  pQVar5 = this->q_ptr;
  if (rootItem == (QGraphicsItem *)0x0) {
    rootItem = pQVar5;
  }
  pQVar4 = QGraphicsItem::panel(rootItem);
  pQVar5 = QGraphicsItem::panel(pQVar5);
  if (pQVar4 != pQVar5) {
    return;
  }
  do {
    if ((rootItem != this->q_ptr) &&
       (pQVar5 = ((rootItem->d_ptr).d)->subFocusItem, pQVar5 != (QGraphicsItem *)0x0)) {
      if (pQVar5 == this->q_ptr) {
LAB_005e568e:
        if ((QGraphicsScene *)this->scene == (QGraphicsScene *)0x0) {
          return;
        }
        bVar3 = QGraphicsScene::isActive((QGraphicsScene *)this->scene);
        if (bVar3) {
          return;
        }
        pQVar5 = this->subFocusItem;
        lVar2 = *(long *)&this->scene->field_0x8;
        *(QGraphicsItem **)(lVar2 + 0x198) = pQVar5;
        *(QGraphicsItem **)(lVar2 + 400) = pQVar5;
        return;
      }
      clearSubFocus((pQVar5->d_ptr).d,(QGraphicsItem *)0x0,stopItem);
    }
    pQVar1 = (rootItem->d_ptr).d;
    pQVar1->subFocusItem = this->q_ptr;
    (*pQVar1->_vptr_QGraphicsItemPrivate[8])();
    pQVar1 = (rootItem->d_ptr).d;
    if ((((pQVar1->field_0x165 & 0x40) != 0) ||
        (rootItem = pQVar1->parent, rootItem == (QGraphicsItem *)0x0)) ||
       (((this->field_0x160 & 0x20) == 0 && ((((rootItem->d_ptr).d)->field_0x160 & 0x20) != 0))))
    goto LAB_005e568e;
  } while( true );
}

Assistant:

void QGraphicsItemPrivate::setSubFocus(QGraphicsItem *rootItem, QGraphicsItem *stopItem)
{
    // Update focus child chain. Stop at panels, or if this item
    // is hidden, stop at the first item with a visible parent.
    QGraphicsItem *parent = rootItem ? rootItem : q_ptr;
    if (parent->panel() != q_ptr->panel())
        return;

    do {
        // Clear any existing ancestor's subFocusItem.
        if (parent != q_ptr && parent->d_ptr->subFocusItem) {
            if (parent->d_ptr->subFocusItem == q_ptr)
                break;
            parent->d_ptr->subFocusItem->d_ptr->clearSubFocus(nullptr, stopItem);
        }
        parent->d_ptr->subFocusItem = q_ptr;
        parent->d_ptr->subFocusItemChange();
    } while (!parent->isPanel() && (parent = parent->d_ptr->parent) && (visible || !parent->d_ptr->visible));

    if (scene && !scene->isActive()) {
        scene->d_func()->passiveFocusItem = subFocusItem;
        scene->d_func()->lastFocusItem = subFocusItem;
    }
}